

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinetic.c
# Opt level: O3

void massagekinetic(Item *q1,Item *q2,Item *q3,Item *q4,int sensused)

{
  Symbol *pSVar1;
  Item *pIVar2;
  Symbol *pSVar3;
  Item *pIVar4;
  Item *pIVar5;
  Item *q1_00;
  Reaction *pRVar6;
  int iVar7;
  Item *pIVar8;
  long lVar9;
  Reaction *pRVar10;
  Rterm *pRVar11;
  Rlist *pRVar12;
  Symbol **ppSVar13;
  char **ppcVar14;
  char *pcVar15;
  ulong uVar16;
  List *pLVar17;
  List *pLVar18;
  Item *pIVar19;
  Reaction *pRVar20;
  int array_length;
  uint uVar21;
  char buf1 [8192];
  char local_2038 [8200];
  
  pSVar1 = (q2->element).sym;
  if (((pSVar1->subtype & 0x600U) != 0) && ((pSVar1->u).i != 0)) {
    diag("Merging kinetic blocks not implemented",(char *)0x0);
  }
  pSVar1->subtype = pSVar1->subtype | 0x400;
  numlist = numlist + 1;
  (pSVar1->u).i = numlist;
  sprintf(buf,"\n/* _kinetic_ %s %s */\n#ifndef INSIDE_NMODL\n#define INSIDE_NMODL\n#endif\n",
          ((q2->element).sym)->name,suffix);
  linsertstr(procfunc,buf);
  sprintf(buf,
          "\ntemplate <coreneuron::scopmath::enabled_code code_to_enable = coreneuron::scopmath::enabled_code::all>\nstruct %s%s {\n  int operator()(SparseObj* _so, double* _rhs, _threadargsproto_) const;\n};\ntemplate <coreneuron::scopmath::enabled_code code_to_enable>\nint"
          ,((q2->element).sym)->name,suffix);
  replacstr(q1,buf);
  sprintf(buf,"%s%s<code_to_enable>::operator()",((q2->element).sym)->name,suffix);
  replacstr(q2,buf);
  pIVar8 = insertstr(q3,"()\n");
  if (vectorize != 0) {
    kin_vect1(q1,q2,q4);
    vectorize_substitute(pIVar8,"(SparseObj* _so, double* _rhs, _threadargsproto_) const\n");
  }
  pIVar8 = insertstr(q3,"{_reset=0;\n");
  builtin_strncpy(buf,"{int _reset=0;\n",0x10);
  vectorize_substitute(pIVar8,buf);
  pIVar8 = q3->next;
  if ((pIVar8->itemtype == 0x143) && (iVar7 = strcmp((pIVar8->element).str,"double"), iVar7 == 0)) {
    do {
      do {
        pIVar8 = pIVar8->next;
      } while (pIVar8->itemtype != 0x143);
      pcVar15 = (pIVar8->element).str;
    } while (((*pcVar15 != ';') || (pcVar15[1] != '\n')) || (pcVar15[2] != '\0'));
    pIVar8 = pIVar8->next;
  }
  insertstr(pIVar8,"double b_flux, f_flux, _term; int _i;\n");
  lVar9 = 0x41;
  do {
    pLVar17 = symlist[lVar9];
    for (pLVar18 = pLVar17->next; pRVar20 = conslist, pLVar18 != pLVar17; pLVar18 = pLVar18->next) {
      pIVar2 = (pLVar18->element).itm;
      if (((pIVar2->itemtype == 0x13e) && (((ulong)pIVar2->element & 0x10) != 0)) &&
         (*(int *)&pIVar2[1].next != 0)) {
        *(undefined4 *)&pIVar2[1].next = 0;
      }
    }
    lVar9 = lVar9 + 1;
    pRVar10 = reactlist;
    pRVar6 = conslist;
  } while (lVar9 != 0x7b);
  for (; reactlist = pRVar10, pRVar6 != (Reaction *)0x0; pRVar6 = pRVar6->reactnext) {
    for (pRVar11 = pRVar6->rterm[0]; pRVar11 != (Rterm *)0x0; pRVar11 = pRVar11->rnext) {
      if (pRVar11->isstate != 0) {
        pRVar11->sym->used = -1;
      }
    }
    pRVar10 = reactlist;
  }
  for (; pRVar10 != (Reaction *)0x0; pRVar10 = pRVar10->reactnext) {
    for (pRVar11 = pRVar10->rterm[0]; pRVar11 != (Rterm *)0x0; pRVar11 = pRVar11->rnext) {
      if (pRVar11->isstate != 0) {
        pRVar11->sym->used = -1;
      }
    }
    for (pRVar11 = pRVar10->rterm[1]; pRVar11 != (Rterm *)0x0; pRVar11 = pRVar11->rnext) {
      if (pRVar11->isstate != 0) {
        pRVar11->sym->used = -1;
      }
    }
  }
  if (pRVar20 == (Reaction *)0x0) {
    uVar21 = 0;
    iVar7 = 0;
  }
  else {
    iVar7 = 0;
    uVar21 = 0;
    do {
      pRVar11 = pRVar20->rterm[0];
      while( true ) {
        if (pRVar11 == (Rterm *)0x0) {
          diag("Failed to diagonalize the Kinetic matrix",(char *)0x0);
        }
        pSVar3 = pRVar11->sym;
        if ((pSVar3->used == -1) && ((pSVar3->subtype & 0x20) == 0)) break;
        pRVar11 = pRVar11->rnext;
      }
      pSVar3->varnum = iVar7;
      iVar7 = iVar7 + 1;
      uVar21 = uVar21 + 1;
      pSVar3->used = uVar21;
      pRVar20 = pRVar20->reactnext;
    } while (pRVar20 != (Reaction *)0x0);
  }
  lVar9 = 0x41;
  array_length = iVar7;
  do {
    pLVar17 = symlist[lVar9];
    for (pLVar18 = pLVar17->next; pLVar18 != pLVar17; pLVar18 = pLVar18->next) {
      pIVar2 = (pLVar18->element).itm;
      if (((pIVar2->itemtype == 0x13e) &&
          (pIVar4 = (pIVar2->element).itm, ((ulong)pIVar4 & 0x10) != 0)) &&
         (*(int *)&pIVar2[1].next == -1)) {
        *(int *)(pIVar2 + 2) = array_length;
        uVar21 = uVar21 + 1;
        *(uint *)&pIVar2[1].next = uVar21;
        if (((ulong)pIVar4 & 0x20) == 0) {
          array_length = array_length + 1;
        }
        else {
          array_length = array_length + *(int *)&pIVar2[1].prev;
        }
      }
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x7b);
  if (array_length != 0) {
    pSVar1->used = array_length;
    sprintf(buf,"_slist%d",(ulong)(uint)numlist);
    add_global_var("int",buf,0,1,array_length,1);
    sprintf(buf,"_dlist%d",(ulong)(uint)numlist);
    add_global_var("int",buf,0,1,array_length,1);
    insertstr(q4,"  } return _reset;\n");
    movelist(q1,q4,procfunc);
    pRVar12 = (Rlist *)emalloc(0x50);
    pRVar12->reaction = reactlist;
    reactlist = (Reaction *)0x0;
    pRVar12->sens_parm = sens_parm;
    ppSVar13 = (Symbol **)emalloc(uVar21 * 8);
    pRVar12->symorder = ppSVar13;
    pRVar12->slist_decl = 0;
    lVar9 = 0x41;
    do {
      pLVar17 = symlist[lVar9]->next;
      if (pLVar17 != symlist[lVar9]) {
        do {
          pSVar3 = (pLVar17->element).sym;
          if (((pSVar3->type == 0x13e) && ((pSVar3->subtype & 0x10) != 0)) &&
             (((long)pSVar3->used != 0 &&
              (pRVar12->symorder[(long)pSVar3->used + -1] = pSVar3, sensused != 0)))) {
            add_sens_statelist(pSVar3);
          }
          pLVar17 = pLVar17->next;
        } while (pLVar17 != symlist[lVar9]);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x7b);
    pRVar12->nsym = uVar21;
    pRVar12->ncons = iVar7;
    pRVar12->position = pIVar8;
    pRVar12->endbrace = q4->prev;
    if (sensused != 0) {
      sensmassage(0x10a,q2,numlist);
    }
    pRVar12->sym = pSVar1;
    pRVar12->rlistnext = rlist;
    rlist = pRVar12;
    pRVar12 = (Rlist *)emalloc(0x50);
    pRVar12->reaction = conslist;
    conslist = (Reaction *)0x0;
    pRVar12->sym = pSVar1;
    pRVar12->rlistnext = clist;
    clist = pRVar12;
    ppcVar14 = (char **)emalloc(uVar21 * 8);
    rlist->capacity = ppcVar14;
    pRVar12 = rlist;
    if (0 < (int)uVar21) {
      uVar16 = 0;
      do {
        pRVar12->capacity[uVar16] = "";
        uVar16 = uVar16 + 1;
      } while (uVar21 != uVar16);
    }
    if (compartlist != (List *)0x0) {
      pLVar17 = compartlist->next;
      if (pLVar17 != compartlist) {
        pIVar8 = compartlist;
        do {
          pIVar2 = (pLVar17->next->element).itm;
          pIVar4 = pLVar17->next->next;
          pIVar5 = (pIVar4->element).itm;
          pIVar19 = pIVar2->next;
          if (pIVar19 != pIVar5) {
            q1_00 = (pLVar17->element).itm;
            do {
              pcVar15 = qconcat(q1_00,pIVar2->prev);
              sprintf(local_2038,"(%s)",pcVar15);
              pcVar15 = stralloc(local_2038,(char *)0x0);
              rlist->capacity[(long)((pIVar19->element).sym)->used + -1] = pcVar15;
              pIVar19 = pIVar19->next;
              pIVar8 = compartlist;
            } while (pIVar19 != pIVar5);
          }
          pLVar17 = pIVar4->next;
        } while (pLVar17 != pIVar8);
      }
      freelist(&compartlist);
    }
    lVar9 = 0x41;
    do {
      pLVar17 = symlist[lVar9];
      for (pLVar18 = pLVar17->next; pLVar18 != pLVar17; pLVar18 = pLVar18->next) {
        pIVar8 = (pLVar18->element).itm;
        if (((pIVar8->itemtype == 0x13e) && (((ulong)pIVar8->element & 0x10) != 0)) &&
           (*(int *)&pIVar8[1].next != 0)) {
          *(undefined4 *)&pIVar8[1].next = 0;
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x7b);
    cvode_sbegin = q3;
    cvode_send = q4;
    kin_items_ = newlist();
    for (pIVar8 = cvode_sbegin; pIVar8 != cvode_send->next; pIVar8 = pIVar8->next) {
      lappenditem(kin_items_,pIVar8);
    }
    return;
  }
  diag("KINETIC contains no reactions",(char *)0x0);
}

Assistant:

void massagekinetic(q1, q2, q3, q4, sensused) /*KINETIC NAME stmtlist '}'*/
	Item *q1, *q2, *q3,*q4;
	int sensused;
{
	int count = 0, i, order, ncons;
	Item *q, *qs, *afterbrace;
	Item* qv;
	Symbol *s, *fun;
	Reaction *r1;
	Rterm *rt;
	Rlist *r;
	
	fun = SYM(q2);
	if ((fun->subtype & (DERF|KINF)) && fun->u.i) {
		diag("Merging kinetic blocks not implemented", (char *)0);
	}
	fun->subtype |= KINF;
	numlist++;
	fun->u.i = numlist;
	
#if 0
	Sprintf(buf, "static int %s();\n", SYM(q2)->name);
	Linsertstr(procfunc, buf);
	replacstr(q1, "\nstatic int");
#else
	Sprintf(buf,
	  "\n"
	  "/* _kinetic_ %s %s */\n"
	  "#ifndef INSIDE_NMODL\n"
	  "#define INSIDE_NMODL\n"
	  "#endif\n"
	  , SYM(q2)->name, suffix);
	Linsertstr(procfunc, buf);
	Sprintf(buf, "\ntemplate <coreneuron::scopmath::enabled_code code_to_enable = coreneuron::scopmath::enabled_code::all>\nstruct %s%s {\n  int operator()(SparseObj* _so, double* _rhs, _threadargsproto_) const;\n};\ntemplate <coreneuron::scopmath::enabled_code code_to_enable>\nint", SYM(q2)->name, suffix);
	replacstr(q1, buf);
	Sprintf(buf, "%s%s<code_to_enable>::operator()", SYM(q2)->name, suffix);
	replacstr(q2, buf);
#endif
	qv = insertstr(q3, "()\n");
#if VECTORIZE
if (vectorize) {
	kin_vect1(q1, q2, q4);
	vectorize_substitute(qv, "(SparseObj* _so, double* _rhs, _threadargsproto_) const\n");
}
#endif
	qv = insertstr(q3, "{_reset=0;\n");
#if VECTORIZE
Sprintf(buf, "{int _reset=0;\n");
	vectorize_substitute(qv, buf);
#endif
	afterbrace = q3->next;
#if Glass
 	/* Make sure that if the next statement was LOCAL xxx, we skip
 	past it to do any of the other declarations. DRB */
 	if(afterbrace->itemtype==STRING &&
 		!strcmp(afterbrace->element.str,"double")){
 		for(afterbrace = afterbrace->next ;
 			afterbrace->itemtype!=STRING ||
 			strcmp(afterbrace->element.str,";\n") ;
 			afterbrace=afterbrace->next);
 		if(afterbrace->itemtype==STRING &&
 		!strcmp(afterbrace->element.str,";\n"))
 			afterbrace=afterbrace->next;
 		}

#endif
	qv = insertstr(afterbrace, "double b_flux, f_flux, _term; int _i;\n");
#if 0 && VECTORIZE
	vectorize_substitute(qv, "int _i;\n");
#endif
	/* also after these declarations will go initilization statements */
	
	order = 0;
	/* the varnum and order of the states is such that diagonals of
	conservation equations must be first.  This is done by setting
	s->used=-1 for all states and then numbering first with respect
	to the conslist and then the remaining that are still -1
	*/
	/* mark only the isstate states */
	SYMITER(NAME) {
		if ((s->subtype & STAT) && s->used) {
			s->used = 0;
		}
	}
	for (r1 = conslist; r1; r1 = r1->reactnext) {
		for (rt = r1->rterm[0]; rt; rt = rt->rnext) {
			if (rt->isstate) {
				rt->sym->used = -1;
			}
		}
	}
	for (r1 = reactlist; r1; r1 = r1->reactnext) {
		for (rt = r1->rterm[0]; rt; rt = rt->rnext) {
			if (rt->isstate) {
				rt->sym->used = -1;
			}
		}
		for (rt = r1->rterm[1]; rt; rt = rt->rnext) {
			if (rt->isstate) {
				rt->sym->used = -1;
			}
		}
	}

	/* diagonals of the conservation relations are first */
	for (r1 = conslist; r1; r1 = r1->reactnext) {
		for (rt = r1->rterm[0]; rt; rt = rt->rnext) {
		   if ((rt->sym->used == -1) && !(rt->sym->subtype & ARRAY)) {
				rt->sym->varnum = count++;
				rt->sym->used = ++order; /*first is 1*/
				break;
		   }
		}
		if (!rt) {
		   diag("Failed to diagonalize the Kinetic matrix", (char *)0);
		}
	}
	ncons = count; /* can't use array as conservation diagonal */
	/* others can be in any order */
	SYMITER(NAME) {
		if ((s->subtype & STAT) && s->used == -1) {
			s->varnum = count;
			s->used = ++order; /* count and order  distinct states */
			if (s->subtype & ARRAY) { int dim = s->araydim;
				count += dim;
			}else{
				count++;
			}
		}
	}
	if (count == 0) {
		diag("KINETIC contains no reactions", (char *)0);
	}
	fun->used = count;

	Sprintf(buf, "_slist%d", numlist);
	add_global_var("int", buf, 0, 1, count, 1);
	Sprintf(buf, "_dlist%d", numlist);
	add_global_var("int", buf, 0, 1, count, 1);

	insertstr(q4, "  } return _reset;\n");
	movelist(q1, q4, procfunc);

	r = (Rlist *)emalloc(sizeof(Rlist));
	r->reaction = reactlist;
	reactlist = (Reaction *)0;
	r->sens_parm = sens_parm;
	r->symorder = (Symbol **)emalloc((unsigned)order*sizeof(Symbol *));
	r->slist_decl = 0;
	/*the reason that we can't just keep this info in s->varnum is that
	more than one block can have the same state with a different varnum */
	SYMITER(NAME) {
		if ((s->subtype & STAT) && s->used) {
			r->symorder[s->used - 1] = s;
			if (sensused) {
				add_sens_statelist(s);
			}
		}
	}
	r->nsym = order;
	r->ncons = ncons;
	r->position = afterbrace;
	r->endbrace = q4->prev;	/* needed for Dstate with COMPARTMENT */
	if (sensused) {
		/* fun now is the interface and fun->used is all the states */
		sensmassage(DERIVATIVE, q2, numlist);
		/* this sets sens_parm to 0 */
	}
	r->sym = fun;
	r->rlistnext = rlist;
	rlist = r;
	r = (Rlist *)emalloc(sizeof(Rlist));
	r->reaction = conslist;
	conslist = (Reaction *)0;
	r->sym = fun;
	r->rlistnext = clist;
	clist = r;

	/* handle compartlist if any */
	rlist->capacity = (char **)emalloc((unsigned)order*sizeof(char *));
	for (i=0; i<order; i++) {
		rlist->capacity[i] = "";
	}
	if (compartlist) {
		char buf1[NRN_BUFSIZE];
		Item *q, *qexp, *qb, *qend, *q1;
		ITERATE(q, compartlist) {
			qexp = ITM(q); q = q->next;
			qb = ITM(q); q = q->next;
			qend = ITM(q);
			for (q1 = qb->next; q1 != qend; q1 = q1->next) {
				Sprintf(buf1, "(%s)", qconcat(qexp, qb->prev));
rlist->capacity[SYM(q1)->used - 1] = stralloc(buf1, (char *)0);
			}
		}
		freelist(&compartlist);
	}

	SYMITER(NAME) {
		if ((s->subtype & STAT) && s->used) {
			s->used = 0;
		}
	}
#if CVODE
	cvode_sbegin = q3;
	cvode_send = q4;
	kin_items_ = newlist();
	for (q = cvode_sbegin; q != cvode_send->next; q = q->next) {
		lappenditem(kin_items_, q);
	}
#endif
}